

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_compute_prehash
               (secp256k1_context *ctx,uchar *output,secp256k1_pubkey *pubkeys,size_t n_pubkeys,
               secp256k1_fe *nonce_ge_x,uchar *msghash32)

{
  bool bVar1;
  int iVar2;
  ulong extraout_RDX;
  ulong uVar3;
  uchar *data;
  secp256k1_context *r;
  size_t buflen;
  uchar buf [33];
  int iStack_1a4;
  byte abStack_1a0 [32];
  secp256k1_sha256 sStack_180;
  size_t *psStack_118;
  secp256k1_pubkey *psStack_110;
  secp256k1_context *psStack_108;
  secp256k1_sha256 *psStack_100;
  size_t sStack_f8;
  code *pcStack_f0;
  uchar *local_e0;
  uchar *local_d8;
  size_t local_d0;
  uchar local_c8 [48];
  secp256k1_sha256 local_98;
  
  local_d0 = 0x21;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  pcStack_f0 = (code *)0x113a56;
  local_e0 = msghash32;
  local_d8 = output;
  secp256k1_fe_get_b32(local_c8,nonce_ge_x);
  pcStack_f0 = (code *)0x113a66;
  secp256k1_sha256_write(&local_98,local_c8,0x20);
  if (n_pubkeys != 0) {
    do {
      pcStack_f0 = (code *)0x113a91;
      data = local_c8;
      r = ctx;
      iVar2 = secp256k1_ec_pubkey_serialize(ctx,local_c8,&local_d0,pubkeys,0x102);
      if (iVar2 == 0) {
        pcStack_f0 = secp256k1_compute_sighash;
        secp256k1_compute_prehash_cold_1();
        sStack_180.s[0] = 0x6a09e667;
        sStack_180.s[1] = 0xbb67ae85;
        sStack_180.s[2] = 0x3c6ef372;
        sStack_180.s[3] = 0xa54ff53a;
        sStack_180.s[4] = 0x510e527f;
        sStack_180.s[5] = 0x9b05688c;
        sStack_180.s[6] = 0x1f83d9ab;
        sStack_180.s[7] = 0x5be0cd19;
        sStack_180.bytes = 0;
        psStack_118 = &local_d0;
        psStack_110 = pubkeys;
        psStack_108 = ctx;
        psStack_100 = &local_98;
        sStack_f8 = n_pubkeys;
        pcStack_f0 = (code *)local_c8;
        if (extraout_RDX != 0) {
          uVar3 = extraout_RDX;
          do {
            abStack_1a0[0] = (byte)uVar3 & 0x7f;
            secp256k1_sha256_write(&sStack_180,abStack_1a0,1);
            bVar1 = 0x7f < uVar3;
            uVar3 = uVar3 >> 7;
          } while (bVar1);
        }
        secp256k1_sha256_write(&sStack_180,data,0x20);
        secp256k1_sha256_finalize(&sStack_180,abStack_1a0);
        secp256k1_scalar_set_b32((secp256k1_scalar *)r,abStack_1a0,&iStack_1a4);
        return;
      }
      pcStack_f0 = (code *)0x113aa5;
      secp256k1_sha256_write(&local_98,local_c8,0x21);
      pubkeys = pubkeys + 1;
      n_pubkeys = n_pubkeys - 1;
    } while (n_pubkeys != 0);
  }
  pcStack_f0 = (code *)0x113ac5;
  secp256k1_sha256_write(&local_98,local_e0,0x20);
  pcStack_f0 = (code *)0x113ad2;
  secp256k1_sha256_finalize(&local_98,local_d8);
  return;
}

Assistant:

static void secp256k1_compute_prehash(const secp256k1_context *ctx, unsigned char *output, const secp256k1_pubkey *pubkeys, size_t n_pubkeys, const secp256k1_fe *nonce_ge_x, const unsigned char *msghash32) {
    size_t i;
    unsigned char buf[33];
    size_t buflen = sizeof(buf);
    secp256k1_sha256 hasher;
    secp256k1_sha256_initialize(&hasher);

    /* Encode nonce */
    secp256k1_fe_get_b32(buf, nonce_ge_x);
    secp256k1_sha256_write(&hasher, buf, 32);

    /* Encode pubkeys */
    for (i = 0; i < n_pubkeys; i++) {
        CHECK(secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &pubkeys[i], SECP256K1_EC_COMPRESSED));
        secp256k1_sha256_write(&hasher, buf, sizeof(buf));
    }

    /* Encode message */
    secp256k1_sha256_write(&hasher, msghash32, 32);

    /* Finish */
    secp256k1_sha256_finalize(&hasher, output);
}